

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

GCcdata * lj_cdata_newv(CTState *cts,CTypeID id,CTSize sz,CTSize align)

{
  long lVar1;
  MSize osz;
  void *pvVar2;
  ulong uVar3;
  GCcdata *pGVar4;
  uint in_ECX;
  undefined4 in_EDX;
  undefined2 in_SI;
  long in_RDI;
  GCcdata *cd;
  uintptr_t almask;
  uintptr_t adata;
  char *p;
  MSize extra;
  global_State *g;
  MSize in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  
  if (in_ECX < 4) {
    osz = 0;
  }
  else {
    osz = (1 << ((byte)in_ECX & 0x1f)) - 8;
  }
  pvVar2 = lj_mem_realloc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,osz,
                          in_stack_ffffffffffffffb0);
  uVar3 = (ulong)((1 << ((byte)in_ECX & 0x1f)) - 1);
  uVar3 = (long)pvVar2 + uVar3 + 0x10 & (uVar3 ^ 0xffffffffffffffff);
  pGVar4 = (GCcdata *)(uVar3 - 8);
  *(short *)(uVar3 - 0x10) = (short)pGVar4 - (short)pvVar2;
  *(short *)(uVar3 - 0xe) = (short)osz + 0x10;
  *(undefined4 *)(uVar3 - 0xc) = in_EDX;
  lVar1 = *(long *)(in_RDI + 0x18);
  (pGVar4->nextgc).gcptr32 = *(uint32_t *)(lVar1 + 0x30);
  *(int *)(lVar1 + 0x30) = (int)pGVar4;
  *(byte *)(uVar3 - 4) = *(byte *)(lVar1 + 0x28) & 3;
  *(byte *)(uVar3 - 4) = *(byte *)(uVar3 - 4) | 0x80;
  *(undefined1 *)(uVar3 - 3) = 10;
  *(undefined2 *)(uVar3 - 2) = in_SI;
  return pGVar4;
}

Assistant:

GCcdata *lj_cdata_newv(CTState *cts, CTypeID id, CTSize sz, CTSize align)
{
  global_State *g;
  MSize extra = sizeof(GCcdataVar) + sizeof(GCcdata) +
		(align > CT_MEMALIGN ? (1u<<align) - (1u<<CT_MEMALIGN) : 0);
  char *p = lj_mem_newt(cts->L, extra + sz, char);
  uintptr_t adata = (uintptr_t)p + sizeof(GCcdataVar) + sizeof(GCcdata);
  uintptr_t almask = (1u << align) - 1u;
  GCcdata *cd = (GCcdata *)(((adata + almask) & ~almask) - sizeof(GCcdata));
  lua_assert((char *)cd - p < 65536);
  cdatav(cd)->offset = (uint16_t)((char *)cd - p);
  cdatav(cd)->extra = extra;
  cdatav(cd)->len = sz;
  g = cts->g;
  setgcrefr(cd->nextgc, g->gc.root);
  setgcref(g->gc.root, obj2gco(cd));
  newwhite(g, obj2gco(cd));
  cd->marked |= 0x80;
  cd->gct = ~LJ_TCDATA;
  cd->ctypeid = id;
  return cd;
}